

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>
               *src,assign_op<double,_double> *func)

{
  XprType *func_00;
  Matrix<double,__1,__1,_0,__1,__1> *dstExpr;
  undefined1 local_78 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>
  *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  srcEvaluator.
  super_unary_evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>,_Eigen::internal::IndexBased,_double>
  .m_xpr = (XprType *)func;
  evaluator<Eigen::IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<-1>_>_>
  ::evaluator((evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>
               *)local_38,src);
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_unary_evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>,_Eigen::internal::IndexBased,_double>
                     .m_xpr);
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_unary_evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>,_Eigen::internal::IndexBased,_double>
            .m_xpr;
  dstExpr = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_78,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_78);
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<-1>_>_>
  ::~evaluator((evaluator<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>
                *)local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}